

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O3

Surface * __thiscall Assimp::LWO::Surface::operator=(Surface *this,Surface *param_1)

{
  undefined3 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  
  std::__cxx11::string::_M_assign((string *)this);
  (this->mColor).r = (param_1->mColor).r;
  (this->mColor).g = (param_1->mColor).g;
  (this->mColor).b = (param_1->mColor).b;
  uVar1 = *(undefined3 *)&param_1->field_0x2d;
  fVar2 = param_1->mDiffuseValue;
  fVar3 = param_1->mSpecularValue;
  fVar4 = param_1->mTransparency;
  fVar5 = param_1->mGlossiness;
  fVar6 = param_1->mLuminosity;
  fVar7 = param_1->mColorHighlights;
  fVar8 = param_1->mMaximumSmoothAngle;
  this->bDoubleSided = param_1->bDoubleSided;
  *(undefined3 *)&this->field_0x2d = uVar1;
  this->mDiffuseValue = fVar2;
  this->mSpecularValue = fVar3;
  this->mTransparency = fVar4;
  this->mGlossiness = fVar5;
  this->mLuminosity = fVar6;
  this->mColorHighlights = fVar7;
  this->mMaximumSmoothAngle = fVar8;
  std::__cxx11::string::_M_assign((string *)&this->mVCMap);
  this->mVCMapType = param_1->mVCMapType;
  if (this != param_1) {
    std::__cxx11::list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Shader>>
              ((list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>> *)&this->mShaders,
               (param_1->mShaders).
               super__List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>._M_impl.
               _M_node.super__List_node_base._M_next,&param_1->mShaders);
    std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Texture>>
              ((list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
               &this->mColorTextures,
               (param_1->mColorTextures).
               super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl
               ._M_node.super__List_node_base._M_next,&param_1->mColorTextures);
    std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Texture>>
              ((list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
               &this->mDiffuseTextures,
               (param_1->mDiffuseTextures).
               super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl
               ._M_node.super__List_node_base._M_next,&param_1->mDiffuseTextures);
    std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Texture>>
              ((list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
               &this->mSpecularTextures,
               (param_1->mSpecularTextures).
               super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl
               ._M_node.super__List_node_base._M_next,&param_1->mSpecularTextures);
    std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Texture>>
              ((list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
               &this->mOpacityTextures,
               (param_1->mOpacityTextures).
               super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl
               ._M_node.super__List_node_base._M_next,&param_1->mOpacityTextures);
    std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Texture>>
              ((list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
               &this->mBumpTextures,
               (param_1->mBumpTextures).
               super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl
               ._M_node.super__List_node_base._M_next,&param_1->mBumpTextures);
    std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Texture>>
              ((list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
               &this->mGlossinessTextures,
               (param_1->mGlossinessTextures).
               super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl
               ._M_node.super__List_node_base._M_next,&param_1->mGlossinessTextures);
    std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
    _M_assign_dispatch<std::_List_const_iterator<Assimp::LWO::Texture>>
              ((list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
               &this->mReflectionTextures,
               (param_1->mReflectionTextures).
               super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl
               ._M_node.super__List_node_base._M_next,&param_1->mReflectionTextures);
  }
  fVar2 = param_1->mBumpIntensity;
  bVar9 = param_1->mWireframe;
  uVar1 = *(undefined3 *)&param_1->field_0x141;
  fVar3 = param_1->mAdditiveTransparency;
  this->mIOR = param_1->mIOR;
  this->mBumpIntensity = fVar2;
  this->mWireframe = bVar9;
  *(undefined3 *)&this->field_0x141 = uVar1;
  this->mAdditiveTransparency = fVar3;
  return this;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}